

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O0

void __thiscall embree::LineCommentFilter::~LineCommentFilter(LineCommentFilter *this)

{
  LineCommentFilter *in_RDI;
  
  ~LineCommentFilter(in_RDI);
  ::operator_delete(in_RDI);
  return;
}

Assistant:

LineCommentFilter (const FileName& fileName, const std::string& lineComment)
      : cin(new FileStream(fileName)), lineComment(lineComment) {}